

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  undefined8 extraout_RAX;
  
  if (type != (Descriptor *)0x0) {
    absl::lts_20240722::Mutex::Lock();
    pMVar1 = GetPrototypeNoLock(this,type);
    absl::lts_20240722::Mutex::Unlock();
    return pMVar1;
  }
  GetPrototype((DynamicMessageFactory *)&stack0xffffffffffffffd8);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}